

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_dead_code.hpp
# Opt level: O1

void __thiscall
optimization::remove_dead_code::Remove_Dead_Code::optimize_func
          (Remove_Dead_Code *this,string *funcId,MirFunction *func)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Livevar_Analyse *pLVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  byte bVar4;
  bool bVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  _Self __tmp;
  byte bVar9;
  undefined1 local_71;
  MirFunction *local_70;
  Livevar_Analyse *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  shared_ptr<optimization::livevar_analyse::Block_Live_Var> local_50;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_40;
  Remove_Dead_Code *local_38;
  
  local_68 = (element_type *)0x0;
  local_70 = func;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<optimization::livevar_analyse::Livevar_Analyse,std::allocator<optimization::livevar_analyse::Livevar_Analyse>,mir::inst::MirFunction&>
            (a_Stack_60,&local_68,
             (allocator<optimization::livevar_analyse::Livevar_Analyse> *)&local_71,func);
  this_00 = &this->func_livevar_analyse;
  local_38 = this;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
           ::operator[](this_00,funcId);
  _Var3._M_pi = a_Stack_60[0]._M_pi;
  pLVar2 = local_68;
  local_68 = (Livevar_Analyse *)0x0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pmVar6->
            super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  (pmVar6->
  super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = pLVar2;
  (pmVar6->
  super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = _Var3._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
  }
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
           ::operator[](this_00,funcId);
  livevar_analyse::Livevar_Analyse::build
            ((pmVar6->
             super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  p_Var1 = &(local_70->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (local_70->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    local_40 = &local_70->variables;
    bVar4 = 0;
    do {
      do {
        bVar9 = bVar4;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
                 ::operator[](this_00,funcId);
        pmVar7 = std::
                 map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                 ::operator[](&((pmVar6->
                                super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->livevars,(key_type *)(p_Var8 + 1));
        local_50.
        super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (pmVar7->
                  super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        local_50.
        super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (pmVar7->
             super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
        if (local_50.
            super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_50.
             super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_50.
                  super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_50.
             super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_50.
                  super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar5 = remove_dead_code(local_38,&local_50,(BasicBlk *)&p_Var8[1]._M_parent,local_40);
        if (local_50.
            super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.
                     super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        bVar4 = bVar9 | bVar5;
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      if (bVar9 == 0 && !bVar5) {
        return;
      }
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<optimization::livevar_analyse::Livevar_Analyse>_>_>_>
               ::operator[](this_00,funcId);
      livevar_analyse::Livevar_Analyse::build
                ((pmVar6->
                 super___shared_ptr<optimization::livevar_analyse::Livevar_Analyse,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr);
      p_Var8 = (local_70->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar4 = 0;
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  return;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func) {
    func_livevar_analyse[funcId] =
        std::make_shared<livevar_analyse::Livevar_Analyse>(func);
    func_livevar_analyse[funcId]->build();
    while (true) {  // delete death code for each block and build again util no
                    // death code to remove
      bool modify = false;
      for (auto iter = func.basic_blks.begin(); iter != func.basic_blks.end();
           iter++) {
        modify |= remove_dead_code(
            func_livevar_analyse[funcId]->livevars[iter->first], iter->second,
            func.variables);
      }
      if (!modify) {
        break;
      }
      func_livevar_analyse[funcId]->build();
    }
  }